

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

FSerializer *
Serialize<FSpotList,FSpotList>
          (FSerializer *arc,char *key,TArray<FSpotList,_FSpotList> *value,
          TArray<FSpotList,_FSpotList> *param_4)

{
  bool bVar1;
  uint amount;
  uint i;
  ulong uVar2;
  long lVar3;
  
  if ((arc->w == (FWriter *)0x0) || (value->Count != 0)) {
    bVar1 = FSerializer::BeginArray(arc,key);
    if (arc->r != (FReader *)0x0) {
      if (!bVar1) {
        TArray<FSpotList,_FSpotList>::Clear(value);
        return arc;
      }
      amount = FSerializer::ArraySize(arc);
      TArray<FSpotList,_FSpotList>::Resize(value,amount);
    }
    lVar3 = 0;
    for (uVar2 = 0; uVar2 < value->Count; uVar2 = uVar2 + 1) {
      Serialize(arc,(char *)0x0,(FSpotList *)((long)&value->Array->Type + lVar3),
                (FSpotList *)param_4);
      lVar3 = lVar3 + 0x28;
    }
    FSerializer::EndArray(arc);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, TArray<T, TT> &value, TArray<T, TT> *)
{
	if (arc.isWriting())
	{
		if (value.Size() == 0) return arc;	// do not save empty arrays
	}
	bool res = arc.BeginArray(key);
	if (arc.isReading())
	{
		if (!res)
		{
			value.Clear();
			return arc;
		}
		value.Resize(arc.ArraySize());
	}
	for (unsigned i = 0; i < value.Size(); i++)
	{
		Serialize(arc, nullptr, value[i], (T*)nullptr);
	}
	arc.EndArray();
	return arc;
}